

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O2

string * __thiscall
Kernel::Term::toString_abi_cxx11_(string *__return_storage_ptr__,Term *this,bool topLevel)

{
  uint uVar1;
  TermList TVar2;
  ulong uVar3;
  ostream *out_00;
  long lVar4;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  TermList arg2;
  TermList arg1;
  string local_1f8;
  string local_1d8;
  stringstream out;
  ostream local_1a8 [376];
  
  TVar2 = AtomicSort::superSort();
  if ((Term *)TVar2._content == this) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"$tType",(allocator<char> *)&out);
    return __return_storage_ptr__;
  }
  uVar1 = this->_functor;
  if (((ulong)uVar1 < 0xfffffff9) && (uVar3 = this->_args[0]._content, (uVar3 & 0x10) == 0)) {
    if ((uVar3 & 0x20) == 0) {
      bVar5 = *(int *)(*(long *)(*(long *)(DAT_00a14190 + 0x60) + (ulong)uVar1 * 8) + 0x48) != 5;
      goto LAB_0049072e;
    }
    if (*(uint *)(DAT_00a14190 + 0x20c) == uVar1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      uVar3 = (ulong)(*(uint *)&this->field_0xc & 0xfffffff);
      arg1._content = this->_args[uVar3]._content;
      arg2._content = this->_args[uVar3 - 1]._content;
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      TermList::toString_abi_cxx11_(&local_1d8,&arg1,false);
      std::operator+(&local_228,&local_1d8," > ");
      TermList::toString_abi_cxx11_(&local_1f8,&arg2,false);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                     &local_228,&local_1f8);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&out);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  bVar5 = false;
LAB_0049072e:
  std::__cxx11::stringstream::stringstream((stringstream *)&out);
  headToString_abi_cxx11_(&local_228,this);
  std::operator<<(local_1a8,(string *)&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  uVar1 = *(uint *)&this->field_0xc;
  if (!bVar5 && (uVar1 & 0xfffffff) != 0) {
    local_228._M_dataplus._M_p = (pointer)this->_args[(ulong)uVar1 & 0xfffffff]._content;
    Kernel::operator<<(local_1a8,(TermList *)&local_228);
    for (lVar4 = -1; (uVar1 & 0xfffffff) + (int)lVar4 != 0; lVar4 = lVar4 + -1) {
      out_00 = std::operator<<(local_1a8,',');
      local_228._M_dataplus._M_p =
           (pointer)this->_args[(ulong)(*(uint *)&this->field_0xc & 0xfffffff) + lVar4]._content;
      Kernel::operator<<(out_00,(TermList *)&local_228);
    }
    std::operator<<(local_1a8,")");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

std::string Term::toString(bool topLevel) const
{
  bool printArgs = true;

  if(isSuper()){
    return "$tType";
  }

  if(!isSpecial() && !isLiteral()){
    if(isSort() && static_cast<AtomicSort*>(const_cast<Term*>(this))->isArrowSort()){
      ASS(arity() == 2);
      std::string res;
      TermList arg1 = *(nthArgument(0));
      TermList arg2 = *(nthArgument(1));
      res += topLevel ? "" : "(";
      res += arg1.toString(false) + " > " + arg2.toString();
      res += topLevel ? "" : ")";
      return res;
    }

    printArgs = isSort() || env.signature->getFunction(_functor)->combinator() == Signature::NOT_COMB;
  }

#if NICE_THEORY_OUTPUT
  auto theoryTerm = Kernel::tryNumTraits([&](auto numTraits) {
    using NumTraits = decltype(numTraits);
    auto maybeParMul = [&](auto t) { 
        auto needsPar = t.isTerm() && NumTraits::isAdd(t.term()->functor());
        return t.toString(!needsPar);
      };
    auto uminus = [&]()  {
      std::stringstream out;
      out << "-" << maybeParMul(termArg(0));
      return Option<std::string>(out.str());
    };
    auto binary = [&](auto sym)  {
      auto needsPar = !topLevel;
      auto maybePar = [&](auto t) { 
        return t.toString(
            t.isTerm() && (
              t.term()->functor() == _functor 
              || (NumTraits::isAdd(_functor) && NumTraits::isMul(t.term()->functor()))
              )
            );
      };
      std::stringstream out;
      out << (needsPar ? "(" : "");
      out << maybePar(termArg(0)) << sym << maybePar(termArg(1));
      out << (needsPar ? ")" : "");
      return Option<std::string>(out.str());
    };
    if (isLiteral()) {
      if (NumTraits::isGreater(_functor)) {
        return binary(">");
      } else if (NumTraits::isGeq(_functor)) {
        return binary(">=");
      }
      /* nothing */
    } else if (isSort()) {
      /* nothing */
    } else {
      if (NumTraits::isAdd(_functor)) {
        return binary(" + ");
      } else if (NumTraits::isMul(_functor)) {
        return binary(" ");
      } else if (auto c = NumTraits::tryLinMul(_functor)) {
        return *c == -1 ? some(Output::toString("-", maybeParMul(termArg(0))))
                        : some(Output::toString(*c, " ", maybeParMul(termArg(0))));
      } else if (NumTraits::isFloor(_functor)) {
        return some(Output::toString("⌊", termArg(0), "⌋"));
      } else if (NumTraits::isMinus(_functor)) {
        return uminus();
      }
    }
    /* this means we have an uninterpteted term which will be formatted as usual */
    return Option<std::string>();
  });

  if (theoryTerm.isSome()) {
    return theoryTerm.unwrap();
  }
#endif // NICE_THEORY_OUTPUT

  std::stringstream out;
  out << headToString();
  
  if (_arity && printArgs) {
    out << Output::interleaved(',', anyArgIter(this)) << ")";
  }
  return out.str();
}